

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

HighsStatus
assessCosts(HighsOptions *options,HighsInt ml_col_os,HighsIndexCollection *index_collection,
           vector<double,_std::allocator<double>_> *cost,bool *has_infinite_cost,
           double infinite_cost)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  HighsInt k;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  HighsInt to_k;
  HighsInt from_k;
  double local_48;
  
  local_48 = infinite_cost;
  limits(index_collection,&from_k,&to_k);
  uVar7 = (ulong)from_k;
  if (from_k <= to_k) {
    bVar2 = index_collection->is_interval_;
    bVar3 = index_collection->is_mask_;
    piVar4 = (index_collection->set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (cost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar8 = 0;
    uVar9 = 0xffffffffffffffff;
    for (; (long)uVar7 <= (long)to_k; uVar7 = uVar7 + 1) {
      iVar10 = (int)uVar7;
      if (((bVar2 | bVar3) & 1U) == 0) {
        iVar10 = piVar4[uVar7];
      }
      uVar9 = (ulong)((int)uVar9 + 1);
      if ((bVar2 & 1U) == 0) {
        uVar9 = uVar7 & 0xffffffff;
      }
      if (((bVar3 & 1U) == 0) || (piVar5[iVar10] != 0)) {
        dVar1 = pdVar6[(int)uVar9];
        uVar11 = 0x7ff00000;
        if ((local_48 <= dVar1) || (uVar11 = 0xfff00000, dVar1 <= -local_48)) {
          iVar8 = iVar8 + 1;
          pdVar6[(int)uVar9] = (double)((ulong)uVar11 << 0x20);
        }
      }
    }
    if (0 < iVar8) {
      *has_infinite_cost = true;
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kInfo,
                   "%d |cost| values greater than or equal to %12g are treated as Infinity\n");
    }
  }
  return kOk;
}

Assistant:

HighsStatus assessCosts(const HighsOptions& options, const HighsInt ml_col_os,
                        const HighsIndexCollection& index_collection,
                        vector<double>& cost, bool& has_infinite_cost,
                        const double infinite_cost) {
  HighsStatus return_status = HighsStatus::kOk;
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  if (from_k > to_k) return return_status;

  return_status = HighsStatus::kOk;
  // Work through the data to be assessed.
  //
  // Loop is k \in [from_k...to_k) covering the entries in the
  // interval, set or mask to be considered.
  //
  // For an interval or mask, these values of k are the columns to be
  // considered in a local sense, as well as the entries in the
  // cost data to be assessed
  //
  // For a set, these values of k are the indices in the set, from
  // which the columns to be considered in a local sense are
  // drawn. The entries in the cost data to be assessed correspond
  // to the values of k
  //
  // Adding the value of ml_col_os to local_col yields the value of
  // ml_col, being the column in a global (whole-model) sense. This is
  // necessary when assessing the costs of columns being added to a
  // model, since they are specified using an interval
  // [0...num_new_col) which must be offset by the current number of
  // columns in the model.
  //
  HighsInt local_col;
  HighsInt usr_col = -1;
  HighsInt num_infinite_cost = 0;
  for (HighsInt k = from_k; k < to_k + 1; k++) {
    if (index_collection.is_interval_ || index_collection.is_mask_) {
      local_col = k;
    } else {
      local_col = index_collection.set_[k];
    }
    if (index_collection.is_interval_) {
      usr_col++;
    } else {
      usr_col = k;
    }
    if (index_collection.is_mask_ && !index_collection.mask_[local_col])
      continue;
    if (cost[usr_col] >= infinite_cost) {
      num_infinite_cost++;
      cost[usr_col] = kHighsInf;
    } else if (cost[usr_col] <= -infinite_cost) {
      num_infinite_cost++;
      cost[usr_col] = -kHighsInf;
    }
  }
  if (num_infinite_cost > 0) {
    has_infinite_cost = true;
    highsLogUser(options.log_options, HighsLogType::kInfo,
                 "%" HIGHSINT_FORMAT
                 " |cost| values greater than or equal to %12g are treated as "
                 "Infinity\n",
                 num_infinite_cost, infinite_cost);
  }
  return return_status;
}